

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::CopyImage::SmokeTest::compareImages
          (SmokeTest *this,testCase *test_case,GLubyte *left_data,GLubyte *right_data)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  GLubyte *pixel;
  string local_248;
  string local_228;
  long local_208 [3];
  MessageBuilder local_1f0;
  GLubyte *local_70;
  GLubyte *right_pixel_data;
  GLubyte *left_pixel_data;
  GLuint pixel_offset;
  GLuint x;
  GLubyte *right_line_data;
  GLubyte *left_line_data;
  uint local_40;
  GLuint line_offset;
  GLuint y;
  GLuint height;
  GLuint line_size;
  GLuint pixel_size;
  GLubyte *right_data_local;
  GLubyte *left_data_local;
  testCase *test_case_local;
  SmokeTest *this_local;
  
  _line_size = right_data;
  right_data_local = left_data;
  left_data_local = (GLubyte *)test_case;
  test_case_local = (testCase *)this;
  height = Utils::getPixelSizeForFormat(test_case->m_internal_format);
  y = height << 4;
  line_offset = 0x10;
  if ((*(int *)left_data_local == 0xde0) || (*(int *)left_data_local == 0x8c18)) {
    line_offset = 1;
  }
  local_40 = 0;
  do {
    if (line_offset <= local_40) {
      return true;
    }
    left_line_data._4_4_ = local_40 * y;
    right_line_data = right_data_local + left_line_data._4_4_;
    _pixel_offset = _line_size + left_line_data._4_4_;
    for (left_pixel_data._4_4_ = 0; left_pixel_data._4_4_ < 0x10;
        left_pixel_data._4_4_ = left_pixel_data._4_4_ + 1) {
      left_pixel_data._0_4_ = left_pixel_data._4_4_ * height;
      right_pixel_data = right_line_data + (uint)left_pixel_data;
      local_70 = _pixel_offset + (uint)left_pixel_data;
      bVar1 = Utils::comparePixels
                        (height,right_pixel_data,height,local_70,*(GLenum *)(left_data_local + 4));
      if ((!bVar1) &&
         (bVar1 = Utils::unpackAndComaprePixels
                            (*(GLenum *)(left_data_local + 8),*(GLenum *)(left_data_local + 0xc),
                             *(GLenum *)(left_data_local + 4),right_pixel_data,
                             *(GLenum *)(left_data_local + 8),*(GLenum *)(left_data_local + 0xc),
                             *(GLenum *)(left_data_local + 4),local_70), !bVar1)) {
        this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        this_01 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<(&local_1f0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (&local_1f0,(char (*) [28])"Not matching pixels found. ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c316fc);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)((long)&left_pixel_data + 4));
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_40);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])"], off: ");
        local_208[0] = (long)right_pixel_data - (long)right_data_local;
        pixel = right_data_local;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_208);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])". Data left: ");
        Utils::getPixelString_abi_cxx11_
                  (&local_228,(Utils *)(ulong)*(uint *)(left_data_local + 4),
                   (GLenum)right_pixel_data,pixel);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_228);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [10])", right: ");
        Utils::getPixelString_abi_cxx11_
                  (&local_248,(Utils *)(ulong)*(uint *)(left_data_local + 4),(GLenum)local_70,pixel)
        ;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_248);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_228);
        tcu::MessageBuilder::~MessageBuilder(&local_1f0);
        return false;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool SmokeTest::compareImages(const testCase& test_case, const GLubyte* left_data, const GLubyte* right_data) const
{
	/* Constants */
	/* Sizes */
	const GLuint pixel_size = Utils::getPixelSizeForFormat(test_case.m_internal_format);
	const GLuint line_size  = pixel_size * m_width;

	GLuint height = m_height;

	if ((GL_TEXTURE_1D == test_case.m_target) || (GL_TEXTURE_1D_ARRAY == test_case.m_target))
	{
		height = 1;
	}

	/* For each line */
	for (GLuint y = 0; y < height; ++y)
	{
		/* Offsets */
		const GLuint line_offset = y * line_size;

		/* Pointers */
		const GLubyte* left_line_data  = left_data + line_offset;
		const GLubyte* right_line_data = right_data + line_offset;

		/* For each pixel of region */
		for (GLuint x = 0; x < m_width; ++x)
		{
			/* Offsets */
			const GLuint pixel_offset = x * pixel_size;

			/* Pointers */
			const GLubyte* left_pixel_data  = left_line_data + pixel_offset;
			const GLubyte* right_pixel_data = right_line_data + pixel_offset;

			/* Compare */
			if (false == Utils::comparePixels(pixel_size, left_pixel_data, pixel_size, right_pixel_data,
											  test_case.m_internal_format))
			{
				if (false == Utils::unpackAndComaprePixels(
								 test_case.m_format, test_case.m_type, test_case.m_internal_format, left_pixel_data,
								 test_case.m_format, test_case.m_type, test_case.m_internal_format, right_pixel_data))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Not matching pixels found. "
						<< "[" << x << ", " << y << "], off: " << left_pixel_data - left_data
						<< ". Data left: " << Utils::getPixelString(test_case.m_internal_format, left_pixel_data)
						<< ", right: " << Utils::getPixelString(test_case.m_internal_format, right_pixel_data)
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}